

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

sample_analysis<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *
nonius::detail::
analyse<std::chrono::duration<double,std::ratio<1l,1000000000l>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>>
          (configuration *cfg,
          environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> param_2,
          __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
          first,__normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
                last)

{
  estimate<double> e;
  estimate<double> e_00;
  back_insert_iterator<std::vector<double,_std::allocator<double>_>_> bVar1;
  iterator iVar2;
  iterator iVar3;
  back_insert_iterator<std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
  bVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  sample_analysis<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *in_RDI;
  vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  samples2;
  anon_class_1_0_00000001 wrap_estimate;
  outlier_classification outliers;
  bootstrap_analysis analysis;
  vector<double,_std::allocator<double>_> samples;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffde8;
  vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  *in_stack_fffffffffffffdf0;
  sample_analysis<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *this;
  size_type in_stack_fffffffffffffe18;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe20;
  vector<double,_std::allocator<double>_> *pvVar5;
  undefined1 *puVar6;
  vector<double,_std::allocator<double>_> *pvVar7;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffeb8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffec0;
  undefined1 local_110 [32];
  double *local_f0;
  double *local_e8;
  undefined8 local_dc;
  int in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  vector<double,_std::allocator<double>_> *pvStack_80;
  double local_78;
  vector<double,_std::allocator<double>_> local_38;
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = in_RCX;
  local_10 = in_RDX;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x219187);
  __gnu_cxx::operator-
            ((__normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
              *)in_stack_fffffffffffffdf0,
             (__normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
              *)in_stack_fffffffffffffde8);
  std::vector<double,_std::allocator<double>_>::reserve
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  bVar1 = std::back_inserter<std::vector<double,std::allocator<double>>>(in_stack_fffffffffffffde8);
  std::
  transform<__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>,std::back_insert_iterator<std::vector<double,std::allocator<double>>>,nonius::detail::analyse<std::chrono::duration<double,std::ratio<1l,1000000000l>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>>(nonius::configuration,nonius::environment<std::chrono::duration<double,std::ratio<1l,1000000000l>>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>)::_lambda(std::chrono::duration<double,std::ratio<1l,1000000000l>>)_1_>
            (local_10,local_18,bVar1.container);
  iVar2 = std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffde8);
  iVar3 = std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffde8);
  analyse_samples<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((double)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff2c,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar2._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar3._M_current);
  pvVar7 = &local_38;
  local_e8 = (double *)
             std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffde8);
  local_f0 = (double *)std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffde8);
  classify_outliers<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  puVar6 = local_110;
  std::
  vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  ::vector((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
            *)0x2192ec);
  std::vector<double,_std::allocator<double>_>::size(&local_38);
  std::
  vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  ::reserve((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
             *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  pvVar5 = &local_38;
  iVar2 = std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffde8);
  iVar3 = std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffde8);
  bVar4 = std::
          back_inserter<std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>
                    ((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                      *)in_stack_fffffffffffffde8);
  std::
  transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::back_insert_iterator<std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>,nonius::detail::analyse<std::chrono::duration<double,std::ratio<1l,1000000000l>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>>(nonius::configuration,nonius::environment<std::chrono::duration<double,std::ratio<1l,1000000000l>>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>)::_lambda(double)_1_>
            (iVar2._M_current,iVar3._M_current,bVar4.container);
  this = in_RDI;
  std::
  vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  ::vector(in_stack_fffffffffffffdf0,
           (vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
            *)in_stack_fffffffffffffde8);
  e.lower_bound = (double)bVar4.container;
  e.point = (double)pvVar5;
  e.upper_bound = (double)puVar6;
  e.confidence_interval = (double)pvVar7;
  analyse<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,___gnu_cxx::__normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this,e);
  e_00.lower_bound = (double)bVar4.container;
  e_00.point = (double)pvVar5;
  e_00.upper_bound = (double)puVar6;
  e_00.confidence_interval = (double)pvVar7;
  analyse<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,___gnu_cxx::__normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this,e_00);
  (in_RDI->outliers).samples_seen = (undefined4)local_dc;
  (in_RDI->outliers).low_severe = local_dc._4_4_;
  (in_RDI->outliers).low_mild = in_stack_ffffffffffffff2c;
  (in_RDI->outliers).high_mild = in_stack_ffffffffffffff30;
  (in_RDI->outliers).high_severe = in_stack_ffffffffffffff34;
  in_RDI->outlier_variance = local_78;
  std::
  vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  ::~vector((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
             *)pvStack_80);
  std::vector<double,_std::allocator<double>_>::~vector(pvStack_80);
  return in_RDI;
}

Assistant:

sample_analysis<Duration> analyse(configuration cfg, environment<Duration>, Iterator first, Iterator last) {
            std::vector<double> samples;
            samples.reserve(last - first);
            std::transform(first, last, std::back_inserter(samples), [](Duration d) { return d.count(); });

            auto analysis = nonius::detail::analyse_samples(cfg.confidence_interval, cfg.resamples, samples.begin(), samples.end());
            auto outliers = nonius::detail::classify_outliers(samples.begin(), samples.end());

            auto wrap_estimate = [](estimate<double> e) {
                return estimate<Duration> {
                    Duration(e.point),
                    Duration(e.lower_bound),
                    Duration(e.upper_bound),
                    e.confidence_interval,
                };
            };
            std::vector<Duration> samples2;
            samples2.reserve(samples.size());
            std::transform(samples.begin(), samples.end(), std::back_inserter(samples2), [](double d) { return Duration(d); });
            return {
                std::move(samples2),
                wrap_estimate(analysis.mean),
                wrap_estimate(analysis.standard_deviation),
                outliers,
                analysis.outlier_variance,
            };
        }